

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.hpp
# Opt level: O1

void __thiscall Camera::Camera(Camera *this,Json *conf)

{
  bool bVar1;
  const_reference pvVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar6;
  vec3f vVar7;
  const_iterator result;
  vector<int,_std::allocator<int>_> resolution;
  bool ret;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_80;
  vector<int,_std::allocator<int>_> local_60;
  const_iterator local_48;
  undefined1 local_28 [16];
  
  this->_vptr_Camera = (_func_int **)&PTR___cxa_pure_virtual_0016ccf8;
  this->mirror = false;
  (this->position).x = 0.0;
  (this->position).y = 0.0;
  *(undefined8 *)&(this->position).z = 0;
  (this->look_at).y = 0.0;
  (this->look_at).z = 0.0;
  (this->up).x = 0.0;
  (this->up).y = 0.0;
  (this->up).z = 0.0;
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)conf,"resolution");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::get<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_0>
            (&local_60,pvVar2);
  this->resx = *local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  this->resy = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[1];
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)conf,"transform");
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)pvVar2,"position");
  vVar7 = json2vec3f(pvVar2);
  (this->position).x = (float)(int)vVar7._0_8_;
  (this->position).y = (float)(int)((ulong)vVar7._0_8_ >> 0x20);
  (this->position).z = vVar7.z;
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)conf,"transform");
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)pvVar2,"look_at");
  vVar7 = json2vec3f(pvVar2);
  (this->look_at).x = (float)(int)vVar7._0_8_;
  (this->look_at).y = (float)(int)((ulong)vVar7._0_8_ >> 0x20);
  (this->look_at).z = vVar7.z;
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)conf,"transform");
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)pvVar2,"up");
  vVar7 = json2vec3f(pvVar2);
  fVar6 = vVar7.z;
  fVar3 = vVar7.x;
  fVar5 = vVar7.y;
  fVar4 = fVar6 * fVar6 + fVar3 * fVar3 + fVar5 * fVar5;
  if (fVar4 < 0.0) {
    local_28._8_4_ = extraout_XMM0_Dc;
    local_28._0_8_ = vVar7._0_8_;
    local_28._12_4_ = extraout_XMM0_Dd;
    fVar4 = sqrtf(fVar4);
    fVar3 = (float)local_28._0_4_;
    fVar5 = (float)local_28._4_4_;
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  fVar4 = 1.0 / fVar4;
  (this->up).x = fVar4 * fVar3;
  (this->up).y = fVar4 * fVar5;
  (this->up).z = fVar6 * fVar4;
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)conf,"transform");
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::find<char_const(&)[7]>
            (&local_48,
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              *)pvVar2,(char (*) [7])"mirror");
  local_80.m_object =
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::operator[]<char_const>
                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   *)conf,"transform");
  local_80.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_80.m_it.array_iterator._M_current = (pointer)0x0;
  local_80.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  if ((local_80.m_object)->m_type == array) {
    local_80.m_it.array_iterator._M_current =
         ((((local_80.m_object)->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  else if ((local_80.m_object)->m_type == object) {
    local_80.m_it.object_iterator._M_node =
         &((((local_80.m_object)->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
  }
  else {
    local_80.m_it.primitive_iterator.m_it = 1;
  }
  bVar1 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==(&local_48,&local_80);
  if (!bVar1) {
    pvVar2 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)conf,"transform");
    pvVar2 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)pvVar2,"mirror");
    nlohmann::detail::
    from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
              (pvVar2,(boolean_t *)&local_48);
    this->mirror = local_48.m_object._0_1_;
  }
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)conf,"fov");
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_float,_0>
            (pvVar2,(float *)&local_48);
  this->fov = (local_48.m_object._0_4_ / 180.0) * 3.1415927;
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

Camera(const Json& conf) {
		std::vector<int> resolution = conf["resolution"];
		resx = resolution[0];
		resy = resolution[1];
		position = json2vec3f(conf["transform"]["position"]);
		look_at = json2vec3f(conf["transform"]["look_at"]);
		up = normalized(json2vec3f(conf["transform"]["up"]));
		if (conf["transform"].find("mirror") != conf["transform"].end())
			mirror = conf["transform"]["mirror"];
		float fov_degree = conf["fov"];
		fov = fov_degree / 180 * PI;
	}